

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,std::allocator<char>>::
basic_bson_parser<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
          (basic_bson_parser<jsoncons::bytes_source,std::allocator<char>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,bson_decode_options *options
          ,allocator<char> *temp_alloc)

{
  pointer puVar1;
  int local_3c [3];
  
  *(undefined ***)this = &PTR__basic_bson_parser_00b302c0;
  *(undefined2 *)(this + 8) = 1;
  this[10] = (basic_bson_parser<jsoncons::bytes_source,std::allocator<char>>)0x0;
  *(undefined4 *)(this + 0xc) = 0;
  puVar1 = (source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *(pointer *)(this + 0x10) = puVar1;
  *(pointer *)(this + 0x18) = puVar1;
  *(pointer *)(this + 0x20) =
       (source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  *(undefined4 *)(this + 0x38) =
       *(undefined4 *)(&options->field_0x8 + (long)options->_vptr_bson_decode_options[-3]);
  *(undefined8 *)(this + 0x28) = 0xb300a0;
  *(undefined8 *)(this + 0x30) = 0xb300c8;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(basic_bson_parser<jsoncons::bytes_source,std::allocator<char>> **)(this + 0x58) = this + 0x68;
  *(undefined8 *)(this + 0x60) = 0;
  this[0x68] = (basic_bson_parser<jsoncons::bytes_source,std::allocator<char>>)0x0;
  *(basic_bson_parser<jsoncons::bytes_source,std::allocator<char>> **)(this + 0x78) = this + 0x88;
  *(undefined8 *)(this + 0x80) = 0;
  this[0x88] = (basic_bson_parser<jsoncons::bytes_source,std::allocator<char>>)0x0;
  *(undefined8 *)(this + 0x98) = 0;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  local_3c[2] = 0;
  local_3c[1] = 0;
  local_3c[0] = 0;
  std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
  emplace_back<jsoncons::bson::parse_mode,int,int>
            ((vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>> *)
             (this + 0x98),(parse_mode *)(local_3c + 2),local_3c + 1,local_3c);
  return;
}

Assistant:

basic_bson_parser(Sourceable&& source,
                      const bson_decode_options& options = bson_decode_options(),
                      const TempAllocator& temp_alloc = TempAllocator())
       : source_(std::forward<Sourceable>(source)), 
         options_(options),
         bytes_buffer_(temp_alloc),
         name_buffer_(temp_alloc),
         text_buffer_(temp_alloc),
         state_stack_(temp_alloc)
    {
        state_stack_.emplace_back(parse_mode::root,0,0);
    }